

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

IT_PLAYING * new_playing(DUMB_IT_SIGRENDERER *itsr)

{
  void *pvVar1;
  long in_RDI;
  IT_PLAYING *r;
  IT_PLAYING *local_8;
  
  if (*(long *)(in_RDI + 0x2e90) == 0) {
    local_8 = (IT_PLAYING *)malloc(0x128);
    if (local_8 != (IT_PLAYING *)0x0) {
      (local_8->resampler).fir_resampler_ratio = 0.0;
      pvVar1 = resampler_create();
      (local_8->resampler).fir_resampler[0] = pvVar1;
      if ((local_8->resampler).fir_resampler[0] == (void *)0x0) {
        free(local_8);
        local_8 = (IT_PLAYING *)0x0;
      }
      else {
        pvVar1 = resampler_create();
        (local_8->resampler).fir_resampler[1] = pvVar1;
        if ((local_8->resampler).fir_resampler[1] == (void *)0x0) {
          resampler_delete((void *)0x8611fb);
          free(local_8);
          local_8 = (IT_PLAYING *)0x0;
        }
      }
    }
  }
  else {
    local_8 = *(IT_PLAYING **)(in_RDI + 0x2e90);
    *(IT_PLAYING **)(in_RDI + 0x2e90) = local_8->next;
  }
  return local_8;
}

Assistant:

static IT_PLAYING *new_playing(DUMB_IT_SIGRENDERER *itsr)
{
	IT_PLAYING *r;

	if (itsr->free_playing != NULL)
	{
		r = itsr->free_playing;
		itsr->free_playing = r->next;
		return r;
	}
	r = (IT_PLAYING *)malloc(sizeof(IT_PLAYING));
	if (r)
	{
		r->resampler.fir_resampler_ratio = 0.0;
		r->resampler.fir_resampler[0] = resampler_create();
		if ( !r->resampler.fir_resampler[0] ) {
			free( r );
			return NULL;
		}
		r->resampler.fir_resampler[1] = resampler_create();
		if ( !r->resampler.fir_resampler[1] ) {
			resampler_delete( r->resampler.fir_resampler[0] );
			free( r );
			return NULL;
		}
	}
	return r;
}